

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<1,_460>::ContinuousPhotons::verifySize(int NPL)

{
  undefined8 *puVar1;
  
  if (0 < NPL) {
    return;
  }
  tools::Log::error<char_const*>("Inconsistent data size");
  tools::Log::info<char_const*>("Expected NNF > 0");
  tools::Log::info<char_const*,int>("NNF value: {}",NPL);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL ) {

  if ( NPL <= 0 ) {

    Log::error( "Inconsistent data size" );
    Log::info( "Expected NNF > 0" );
    Log::info( "NNF value: {}", NPL );
    throw std::exception();
  }
}